

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint uVar1;
  OPJ_BOOL OVar2;
  uint uVar3;
  opj_tcp_t *poVar4;
  uint uVar5;
  uint p_nb_bytes;
  opj_poc_t_conflict *p_value;
  ulong uVar7;
  OPJ_UINT32 l_tmp;
  OPJ_PROG_ORDER local_3c;
  ulong local_38;
  ulong uVar6;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xdd3,
                  "OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      uVar1 = p_j2k->m_private_image->numcomps;
      p_nb_bytes = 2 - (uVar1 < 0x101);
      uVar6 = (ulong)p_nb_bytes;
      uVar3 = p_nb_bytes * 2 + 5;
      uVar7 = (ulong)p_header_size / (ulong)uVar3;
      OVar2 = 0;
      if (p_header_size % uVar3 == 0 && uVar3 <= p_header_size) {
        if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
          poVar4 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
        }
        else {
          poVar4 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
        }
        uVar3 = 0;
        if ((poVar4->field_0x1638 & 4) != 0) {
          uVar3 = poVar4->numpocs + 1;
        }
        uVar5 = uVar3 + (int)uVar7;
        if (uVar5 < 0x20) {
          poVar4->field_0x1638 = poVar4->field_0x1638 | 4;
          if (uVar3 < uVar5) {
            p_value = poVar4->pocs + uVar3;
            local_38 = uVar6;
            do {
              opj_read_bytes_LE(p_header_data,&p_value->resno0,1);
              opj_read_bytes_LE(p_header_data + 1,&p_value->compno0,p_nb_bytes);
              opj_read_bytes_LE(p_header_data + uVar6 + 1,&p_value->layno1,2);
              uVar3 = poVar4->numlayers;
              if (p_value->layno1 < poVar4->numlayers) {
                uVar3 = p_value->layno1;
              }
              p_value->layno1 = uVar3;
              opj_read_bytes_LE(p_header_data + uVar6 + 3,&p_value->resno1,1);
              opj_read_bytes_LE(p_header_data + uVar6 + 4,&p_value->compno1,p_nb_bytes);
              opj_read_bytes_LE(p_header_data + uVar6 * 2 + 4,(OPJ_UINT32 *)&local_3c,1);
              p_value->prg = local_3c;
              uVar3 = p_value->compno1;
              if (uVar1 <= p_value->compno1) {
                uVar3 = uVar1;
              }
              p_value->compno1 = uVar3;
              p_value = p_value + 1;
              p_header_data = p_header_data + uVar6 * 2 + 5;
              uVar3 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar3;
            } while (uVar3 != 0);
          }
          poVar4->numpocs = uVar5 - 1;
          OVar2 = 1;
        }
        else {
          OVar2 = 0;
          opj_event_msg(p_manager,1,"Too many POCs %d\n",(ulong)uVar5);
        }
      }
      else {
        opj_event_msg(p_manager,1,"Error reading POC marker\n");
      }
      return OVar2;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xdd5,
                  "OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xdd4,
                "OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 i, l_nb_comp, l_tmp;
    opj_image_t * l_image = 00;
    OPJ_UINT32 l_old_poc_nb, l_current_poc_nb, l_current_poc_remaining;
    OPJ_UINT32 l_chunk_size, l_comp_room;

    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    opj_poc_t *l_current_poc = 00;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    l_nb_comp = l_image->numcomps;
    if (l_nb_comp <= 256) {
        l_comp_room = 1;
    } else {
        l_comp_room = 2;
    }
    l_chunk_size = 5 + 2 * l_comp_room;
    l_current_poc_nb = p_header_size / l_chunk_size;
    l_current_poc_remaining = p_header_size % l_chunk_size;

    if ((l_current_poc_nb <= 0) || (l_current_poc_remaining != 0)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading POC marker\n");
        return OPJ_FALSE;
    }

    l_cp = &(p_j2k->m_cp);
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;
    l_old_poc_nb = l_tcp->POC ? l_tcp->numpocs + 1 : 0;
    l_current_poc_nb += l_old_poc_nb;

    if (l_current_poc_nb >= J2K_MAX_POCS) {
        opj_event_msg(p_manager, EVT_ERROR, "Too many POCs %d\n", l_current_poc_nb);
        return OPJ_FALSE;
    }

    /* now poc is in use.*/
    l_tcp->POC = 1;

    l_current_poc = &l_tcp->pocs[l_old_poc_nb];
    for (i = l_old_poc_nb; i < l_current_poc_nb; ++i) {
        opj_read_bytes(p_header_data, &(l_current_poc->resno0),
                       1);                               /* RSpoc_i */
        ++p_header_data;
        opj_read_bytes(p_header_data, &(l_current_poc->compno0),
                       l_comp_room);  /* CSpoc_i */
        p_header_data += l_comp_room;
        opj_read_bytes(p_header_data, &(l_current_poc->layno1),
                       2);                               /* LYEpoc_i */
        /* make sure layer end is in acceptable bounds */
        l_current_poc->layno1 = opj_uint_min(l_current_poc->layno1, l_tcp->numlayers);
        p_header_data += 2;
        opj_read_bytes(p_header_data, &(l_current_poc->resno1),
                       1);                               /* REpoc_i */
        ++p_header_data;
        opj_read_bytes(p_header_data, &(l_current_poc->compno1),
                       l_comp_room);  /* CEpoc_i */
        p_header_data += l_comp_room;
        opj_read_bytes(p_header_data, &l_tmp,
                       1);                                                                 /* Ppoc_i */
        ++p_header_data;
        l_current_poc->prg = (OPJ_PROG_ORDER) l_tmp;
        /* make sure comp is in acceptable bounds */
        l_current_poc->compno1 = opj_uint_min(l_current_poc->compno1, l_nb_comp);
        ++l_current_poc;
    }

    l_tcp->numpocs = l_current_poc_nb - 1;
    return OPJ_TRUE;
}